

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

object_class *
lsvm::object::new_class(package *pkg,symbol *name,object_class *super,uint16_t fields_count)

{
  uint16_t i;
  object_class *poVar1;
  symbolmap *psVar2;
  ulong uVar3;
  undefined2 in_register_0000000a;
  
  poVar1 = (object_class *)
           memory::allocate((ulong)CONCAT22(in_register_0000000a,fields_count) * 8 + 0x28);
  poVar1->pkg = pkg;
  poVar1->name = name;
  poVar1->super = super;
  poVar1->fields_count = fields_count;
  psVar2 = symbol::new_symbolmap();
  poVar1->methods = psVar2;
  for (uVar3 = 0; CONCAT22(in_register_0000000a,fields_count) != uVar3; uVar3 = uVar3 + 1) {
    (&poVar1[1].pkg)[uVar3] = (package *)0x0;
  }
  return poVar1;
}

Assistant:

object_class* new_class(package* pkg, symbol* name, object_class* super, uint16_t fields_count){
    object_class* cls = (object_class*)lsvm::memory::allocate(sizeof(object_class)+(fields_count*sizeof(symbol*)));
    cls->pkg = pkg;
    cls->name = name;
    cls->super = super;
    cls->fields_count = fields_count;
    cls->methods = lsvm::symbol::new_symbolmap();

    for(uint16_t i = 0; i<fields_count; ++i){
        cls->fields[i] = null;
    }

    return cls;
}